

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O2

string * __thiscall
PDFTextString::ToUTF8FromUTF16BE_abi_cxx11_(string *__return_storage_ptr__,PDFTextString *this)

{
  UnicodeString unicodeString;
  EStatusCodeAndString result;
  UnicodeString UStack_58;
  undefined1 local_40 [40];
  
  UnicodeString::UnicodeString(&UStack_58);
  UnicodeString::FromUTF16(&UStack_58,&this->mTextString);
  UnicodeString::ToUTF8_abi_cxx11_((EStatusCodeAndString *)local_40,&UStack_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 8));
  UnicodeString::~UnicodeString(&UStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFTextString::ToUTF8FromUTF16BE() const
{
	UnicodeString unicodeString;

	unicodeString.FromUTF16(mTextString);

	EStatusCodeAndString result = unicodeString.ToUTF8();
	return result.second;
}